

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

string * __thiscall tinyusdz::Path::variant_part_abi_cxx11_(Path *this)

{
  long *plVar1;
  long *plVar2;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  long *local_68;
  long local_60;
  long local_58;
  long lStack_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::operator+(&local_48,"{",&this->_variant_part);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_48);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_98 = *plVar2;
    lStack_90 = plVar1[3];
    local_a8 = &local_98;
  }
  else {
    local_98 = *plVar2;
    local_a8 = (long *)*plVar1;
  }
  local_a0 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_a8,
                              (ulong)(this->_variant_selection_part)._M_dataplus._M_p);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_78 = *plVar2;
    lStack_70 = plVar1[3];
    local_88 = &local_78;
  }
  else {
    local_78 = *plVar2;
    local_88 = (long *)*plVar1;
  }
  local_80 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_88);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_58 = *plVar2;
    lStack_50 = plVar1[3];
    local_68 = &local_58;
  }
  else {
    local_58 = *plVar2;
    local_68 = (long *)*plVar1;
  }
  local_60 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::string::operator=((string *)&this->_variant_part_str,(string *)&local_68);
  if (local_68 != &local_58) {
    operator_delete(local_68,local_58 + 1);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,local_78 + 1);
  }
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return &this->_variant_part_str;
}

Assistant:

const std::string &variant_part() const {
    _variant_part_str =
        "{" + _variant_part + "=" + _variant_selection_part + "}";
    return _variant_part_str;
  }